

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O0

Gia_Man_t * Gia_ManReduceEquiv(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int *pCi2Lit_00;
  void *__s;
  bool bVar4;
  int local_54;
  int local_50;
  int Counter;
  int Counter0;
  int nFanins;
  int iLit;
  int i;
  uint *pMaps;
  uint *pCi2Lit;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObjRi;
  Gia_Man_t *pNew;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  Counter = 1;
  local_50 = 0;
  local_54 = 0;
  nFanins = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar4 = false;
    if (nFanins < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      pObjRo = Gia_ManCo(p,iVar1 + nFanins);
      bVar4 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    pGVar3 = Gia_ObjFanin0(pObjRo);
    pGVar3->Value = 0;
    nFanins = nFanins + 1;
  }
  nFanins = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar4 = false;
    if (nFanins < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      pObjRo = Gia_ManCo(p,iVar1 + nFanins);
      bVar4 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    pGVar3 = Gia_ObjFanin0(pObjRo);
    if (pGVar3->Value == 0) {
      pGVar3 = Gia_ObjFanin0(pObjRo);
      pGVar3->Value = Counter << 1;
      Counter = Counter + 1;
    }
    nFanins = nFanins + 1;
  }
  iVar1 = Gia_ManCiNum(p);
  pCi2Lit_00 = (int *)malloc((long)iVar1 << 2);
  iVar1 = Gia_ManCiNum(p);
  memset(pCi2Lit_00,0xff,(long)iVar1 << 2);
  __s = malloc((long)(Counter << 1) << 2);
  memset(__s,0xff,(long)(Counter << 1) << 2);
  nFanins = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar4 = false;
    if (nFanins < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      pObjRo = Gia_ManCo(p,iVar1 + nFanins);
      bVar4 = false;
      if (pObjRo != (Gia_Obj_t *)0x0) {
        iVar1 = Gia_ManPiNum(p);
        pCi2Lit = (uint *)Gia_ManCi(p,iVar1 + nFanins);
        bVar4 = (Gia_Obj_t *)pCi2Lit != (Gia_Obj_t *)0x0;
      }
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjFanin0Copy(pObjRo);
    iVar2 = Gia_ObjFaninId0p(p,pObjRo);
    if ((iVar2 == 0) && (iVar2 = Gia_ObjFaninC0(pObjRo), iVar2 == 0)) {
      iVar1 = Gia_ManPiNum(p);
      pCi2Lit_00[iVar1 + nFanins] = 0;
      local_50 = local_50 + 1;
    }
    else if (*(int *)((long)__s + (long)iVar1 * 4) == -1) {
      iVar2 = Gia_ObjId(p,(Gia_Obj_t *)pCi2Lit);
      iVar2 = Abc_Var2Lit(iVar2,0);
      *(int *)((long)__s + (long)iVar1 * 4) = iVar2;
    }
    else {
      iVar1 = *(int *)((long)__s + (long)iVar1 * 4);
      iVar2 = Gia_ManPiNum(p);
      pCi2Lit_00[iVar2 + nFanins] = iVar1;
      local_54 = local_54 + 1;
    }
    nFanins = nFanins + 1;
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if ((local_50 != 0) || (pObjRi = (Gia_Obj_t *)p, local_54 != 0)) {
    pObjRi = (Gia_Obj_t *)Gia_ManDupDfsCiMap(p,pCi2Lit_00,(Vec_Int_t *)0x0);
  }
  if (pCi2Lit_00 != (int *)0x0) {
    free(pCi2Lit_00);
  }
  return (Gia_Man_t *)pObjRi;
}

Assistant:

Gia_Man_t * Gia_ManReduceEquiv( Gia_Man_t * p, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObjRi, * pObjRo;
    unsigned * pCi2Lit, * pMaps;
    int i, iLit, nFanins = 1, Counter0 = 0, Counter = 0;
    Gia_ManForEachRi( p, pObjRi, i )
        Gia_ObjFanin0(pObjRi)->Value = 0;
    Gia_ManForEachRi( p, pObjRi, i )
        if ( Gia_ObjFanin0(pObjRi)->Value == 0 )
            Gia_ObjFanin0(pObjRi)->Value = 2*nFanins++;
    pCi2Lit = ABC_FALLOC( unsigned, Gia_ManCiNum(p) );
    pMaps   = ABC_FALLOC( unsigned, 2 * nFanins );
    Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
    {
        iLit = Gia_ObjFanin0Copy( pObjRi );
        if ( Gia_ObjFaninId0p(p, pObjRi) == 0 && Gia_ObjFaninC0(pObjRi) == 0 ) // const 0 
            pCi2Lit[Gia_ManPiNum(p)+i] = 0, Counter0++;
        else if ( ~pMaps[iLit] ) // in this case, ID(pObj) > ID(pRepr) 
            pCi2Lit[Gia_ManPiNum(p)+i] = pMaps[iLit], Counter++; 
        else
            pMaps[iLit] = Abc_Var2Lit( Gia_ObjId(p, pObjRo), 0 );
    }
/*
    Gia_ManForEachCi( p, pObjRo, i )
    {
        if ( ~pCi2Lit[i] )
        {
            Gia_Obj_t * pObj0 = Gia_ObjRoToRi(p, pObjRo);
            Gia_Obj_t * pObj1 = Gia_ObjRoToRi(p, Gia_ManObj(p, pCi2Lit[i]));
            Gia_Obj_t * pFan0 = Gia_ObjChild0( p, Gia_ObjRoToRi(p, pObjRo) );
            Gia_Obj_t * pFan1 = Gia_ObjChild0( p, Gia_ObjRoToRi(p, Gia_ManObj(p, pCi2Lit[i])) );
            assert( pFan0 == pFan1 );
        }
    }
*/
//    if ( fVerbose )
//        printf( "ReduceEquiv detected %d constant regs and %d equivalent regs.\n", Counter0, Counter );
    ABC_FREE( pMaps );
    if ( Counter0 || Counter )
        pNew = Gia_ManDupDfsCiMap( p, (int *)pCi2Lit, NULL );
    else
        pNew = p;
    ABC_FREE( pCi2Lit );
    return pNew;
}